

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtransposeproxymodel.cpp
# Opt level: O0

QModelIndex * __thiscall
QTransposeProxyModelPrivate::uncheckedMapFromSource
          (QTransposeProxyModelPrivate *this,QModelIndex *sourceIndex)

{
  bool bVar1;
  int acolumn;
  int arow;
  parameter_type pQVar2;
  QTransposeProxyModel *adata;
  QModelIndex *in_RDX;
  QTransposeProxyModelPrivate *in_RSI;
  QModelIndex *in_RDI;
  QTransposeProxyModel *q;
  QModelIndex *in_stack_ffffffffffffffc0;
  QModelIndex *this_00;
  
  this_00 = in_RDI;
  pQVar2 = ::QObjectCompatProperty::operator_cast_to_QAbstractItemModel_
                     ((QObjectCompatProperty<QAbstractProxyModelPrivate,_QAbstractItemModel_*,_&QAbstractProxyModelPrivate::_qt_property_model_offset,_&QAbstractProxyModelPrivate::setModelForwarder,_&QAbstractProxyModelPrivate::modelChangedForwarder,_&QAbstractProxyModelPrivate::getModelForwarder>
                       *)0x8b0f32);
  if ((pQVar2 != (parameter_type)0x0) &&
     (bVar1 = QModelIndex::isValid(in_stack_ffffffffffffffc0), bVar1)) {
    adata = q_func(in_RSI);
    acolumn = QModelIndex::column(in_RDX);
    arow = QModelIndex::row(in_RDX);
    QModelIndex::internalPointer(in_RDX);
    QAbstractItemModel::createIndex((QAbstractItemModel *)this_00,arow,acolumn,adata);
    return in_RDI;
  }
  QModelIndex::QModelIndex((QModelIndex *)0x8b0f50);
  return in_RDI;
}

Assistant:

QModelIndex QTransposeProxyModelPrivate::uncheckedMapFromSource(const QModelIndex &sourceIndex) const
{
    if (!model || !sourceIndex.isValid())
        return QModelIndex();
    Q_Q(const QTransposeProxyModel);
    return q->createIndex(sourceIndex.column(), sourceIndex.row(), sourceIndex.internalPointer());
}